

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::aux::bt_peer_connection::write_share_mode(bt_peer_connection *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uchar val;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  bool bVar6;
  span<const_char> buf;
  char local_20 [6];
  byte local_1a;
  
  p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar5 = (element_type *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar5 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
    }
    iVar4 = p_Var3->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar5 = (element_type *)0x0;
        goto LAB_0018db7e;
      }
      LOCK();
      iVar2 = p_Var3->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        p_Var3->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
    this_00 = p_Var3;
    if (p_Var3->_M_use_count == 0) {
      peVar5 = (element_type *)0x0;
    }
LAB_0018db7e:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
  }
  if (this->m_share_mode_id != '\0') {
    local_20[4] = 0x14;
    local_20[0] = '\0';
    local_20[1] = '\0';
    local_20[2] = '\0';
    local_20[3] = '\x03';
    local_1a = (byte)((uint)*(undefined4 *)&(peVar5->super_torrent_hot_members).field_0x48 >> 0x1d)
               & 1;
    buf.m_len = 7;
    buf.m_ptr = local_20;
    local_20[5] = this->m_share_mode_id;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
    counters::inc_stats_counter((this->super_peer_connection).m_counters,0x67,1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void bt_peer_connection::write_share_mode()
	{
		INVARIANT_CHECK;

		auto t = associated_torrent().lock();
		if (m_share_mode_id == 0) return;

		char msg[7] = {0, 0, 0, 3, msg_extended};
		char* ptr = msg + 5;
		aux::write_uint8(m_share_mode_id, ptr);
		aux::write_uint8(t->share_mode(), ptr);
		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_extended);
	}